

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O2

int32_t __thiscall date_parse_result::dayno(date_parse_result *this)

{
  int iVar1;
  int32_t iVar2;
  caldate_t cd;
  caldate_t jan4;
  caldate_t local_20;
  caldate_t local_14;
  
  local_14.y = this->yy;
  local_14.m = 1;
  local_14.d = 4;
  iVar1 = caldate_t::iso_weekday(&local_14);
  local_20.y = this->yy;
  local_20.d = (this->w - iVar1) + -3;
  local_20.m = 1;
  iVar2 = caldate_t::dayno(&local_20);
  return iVar2;
}

Assistant:

int32_t dayno() const
    {
        /* if there's an ISO weekday, convert it to a calendar date */
        if (has_iso_week() && has_year())
        {
            /* 
             *   Calculate the "correction factor" - this is the ISO weekday
             *   number of January 4 of the year, plus 3.  Note that this is
             *   explicitly defined as Jan 4 *Gregorian* by the standard, so
             *   this isn't relative to the calendar we're parsing for.
             */
            caldate_t jan4(yy, 1, 4);
            int corr = jan4.iso_weekday() + 3;

            /* 
             *   Set the date to "January 'ord'", where 'ord' is the ISO
             *   ordinal day number calculated from the weekday and
             *   correction factor.  This won't necessarily be a valid date
             *   in January, but caldate_t handles overflows in the day by
             *   carrying into the month and year as needed.
             */
            caldate_t cd(yy, 1, w - corr);
            return cd.dayno();
        }
        else
        {
            /* set the calendar date to our year, month, and day */
            cal->set_date(yy, mm, dd);

            /* return the day number from the calendar date */
            return cal->dayno();
        }
    }